

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O0

void Fra_ClausAddToStorage(Clu_Man_t *p)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  int *piVar3;
  int local_2c;
  int local_28;
  int k;
  int i;
  int Counter;
  int End;
  int Beg;
  int *pStart;
  Clu_Man_t *p_local;
  
  Counter = 0;
  k = 0;
  piVar3 = Vec_IntArray(p->vLits);
  local_28 = 0;
  do {
    iVar1 = Vec_IntSize(p->vClauses);
    if (iVar1 <= local_28) {
      if (p->fVerbose != 0) {
        printf("Added to storage %d proved clauses (including %d one-hot clauses)\n",(ulong)(uint)k,
               (ulong)(uint)p->nOneHotsProven);
      }
      Vec_IntClear(p->vClauses);
      Vec_IntClear(p->vLits);
      Vec_IntClear(p->vCosts);
      p->nClauses = 0;
      p->fNothingNew = (uint)(k == 0);
      return;
    }
    iVar1 = Vec_IntEntry(p->vClauses,local_28);
    iVar2 = Vec_IntEntry(p->vCosts,local_28);
    if (iVar2 != -1) {
      iVar2 = Vec_IntEntry(p->vCosts,local_28);
      if (iVar2 < 1) {
        __assert_fail("Vec_IntEntry( p->vCosts, i ) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraClaus.c"
                      ,0x5aa,"void Fra_ClausAddToStorage(Clu_Man_t *)");
      }
      if (p->nLutSize < iVar1 - Counter) {
        __assert_fail("End - Beg <= p->nLutSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraClaus.c"
                      ,0x5ab,"void Fra_ClausAddToStorage(Clu_Man_t *)");
      }
      for (local_2c = Counter; local_2c < iVar1; local_2c = local_2c + 1) {
        Vec_IntPush(p->vLitsProven,piVar3[local_2c]);
      }
      p_00 = p->vClausesProven;
      iVar2 = Vec_IntSize(p->vLitsProven);
      Vec_IntPush(p_00,iVar2);
      k = k + 1;
      if (local_28 < p->nOneHots) {
        p->nOneHotsProven = p->nOneHotsProven + 1;
      }
    }
    local_28 = local_28 + 1;
    Counter = iVar1;
  } while( true );
}

Assistant:

void Fra_ClausAddToStorage( Clu_Man_t * p )
{
    int * pStart; 
    int Beg, End, Counter, i, k;
    Beg = 0;
    Counter = 0;
    pStart = Vec_IntArray( p->vLits );
    Vec_IntForEachEntry( p->vClauses, End, i )
    {
        if ( Vec_IntEntry( p->vCosts, i ) == -1 )
        {
            Beg = End;
            continue;
        }
        assert( Vec_IntEntry( p->vCosts, i ) > 0 );
        assert( End - Beg <= p->nLutSize );
        for ( k = Beg; k < End; k++ )
            Vec_IntPush( p->vLitsProven, pStart[k] );
        Vec_IntPush( p->vClausesProven, Vec_IntSize(p->vLitsProven) );
        Beg = End;
        Counter++;

        if ( i < p->nOneHots )
            p->nOneHotsProven++;
    }
    if ( p->fVerbose )
    printf( "Added to storage %d proved clauses (including %d one-hot clauses)\n", Counter, p->nOneHotsProven );

    Vec_IntClear( p->vClauses );
    Vec_IntClear( p->vLits );
    Vec_IntClear( p->vCosts );
    p->nClauses = 0;

    p->fNothingNew = (int)(Counter == 0);
}